

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AppendModuleDefinitionFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,
          cmLinkLineComputer *linkLineComputer,string *config)

{
  cmMakefile *this_00;
  pointer pcVar1;
  pointer pcVar2;
  ModuleDefinitionInfo *pMVar3;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  string flag;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pMVar3 = cmGeneratorTarget::GetModuleDefinitionInfo(target,config);
  if ((pMVar3 != (ModuleDefinitionInfo *)0x0) && ((pMVar3->DefFile)._M_string_length != 0)) {
    this_00 = this->Makefile;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"CMAKE_LINK_DEF_FILE_FLAG","");
    cVar4 = cmMakefile::GetDefinition(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      pcVar1 = ((cVar4.Value)->_M_dataplus)._M_p;
      pcVar2 = (pointer)(cVar4.Value)->_M_string_length;
      (*linkLineComputer->_vptr_cmLinkLineComputer[2])(&local_50,linkLineComputer,pMVar3);
      source._M_str = (char *)local_50;
      source._M_len = local_48;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_90,&this->super_cmOutputConverter,source,SHELL);
      local_b0.field_2._M_allocated_capacity = local_90._M_string_length;
      local_b0.field_2._8_8_ = local_90._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = (iterator)&local_b0;
      local_b0._M_dataplus._M_p = pcVar2;
      local_b0._M_string_length = (size_type)pcVar1;
      cmCatViews_abi_cxx11_(&local_70,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendModuleDefinitionFlag(
  std::string& flags, cmGeneratorTarget const* target,
  cmLinkLineComputer* linkLineComputer, std::string const& config)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    target->GetModuleDefinitionInfo(config);
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  cmValue defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag =
    cmStrCat(*defFileFlag,
             this->ConvertToOutputFormat(
               linkLineComputer->ConvertToLinkReference(mdi->DefFile),
               cmOutputConverter::SHELL));
  this->AppendFlags(flags, flag);
}